

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O0

void __thiscall
btKinematicCharacterController::playerStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btScalar dt)

{
  bool bVar1;
  byte bVar2;
  btScalar *pbVar3;
  btVector3 *pbVar4;
  btVector3 *v2;
  long *in_RDI;
  float in_XMM0_Da;
  btScalar bVar5;
  btScalar bVar6;
  btVector3 move;
  btScalar dtMoving;
  btTransform xform;
  btKinematicCharacterController *in_stack_000000d0;
  btVector3 platformHorizontalStep;
  btScalar platformVerticalOffset;
  btVector3 platformStep;
  btVector3 upVector;
  btScalar in_stack_00000274;
  btCollisionWorld *in_stack_00000278;
  btKinematicCharacterController *in_stack_00000280;
  btTransform *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  btVector3 *in_stack_fffffffffffffee8;
  btVector3 *in_stack_fffffffffffffef0;
  btTransform local_98;
  btScalar local_58 [4];
  btScalar local_48 [4];
  btScalar local_38;
  btVector3 local_34;
  btVector3 local_24;
  float local_14;
  
  local_14 = in_XMM0_Da;
  if ((((*(byte *)((long)in_RDI + 199) & 1) != 0) ||
      (pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)((long)in_RDI + 0xd4)),
      pbVar3 != (btScalar *)0x0)) ||
     ((0.0 < *(float *)(in_RDI + 0x19) &&
      (bVar1 = btVector3::fuzzyZero((btVector3 *)0x1f6bf5), !bVar1)))) {
    bVar2 = (**(code **)(*in_RDI + 0x60))();
    *(byte *)((long)in_RDI + 0xc4) = bVar2 & 1;
    pbVar4 = getUpAxisDirections();
    local_24.m_floats._0_8_ = *(undefined8 *)pbVar4[*(int *)((long)in_RDI + 0xcc)].m_floats;
    local_24.m_floats._8_8_ = *(undefined8 *)(pbVar4[*(int *)((long)in_RDI + 0xcc)].m_floats + 2);
    *(float *)(in_RDI + 4) = -*(float *)((long)in_RDI + 0x3c) * local_14 + *(float *)(in_RDI + 4);
    bVar5 = btVector3::dot(&local_24,(btVector3 *)((long)in_RDI + 0x4c));
    *(float *)(in_RDI + 4) = bVar5 + *(float *)(in_RDI + 4);
    if ((0.0 < *(float *)(in_RDI + 4)) &&
       (*(float *)((long)in_RDI + 0x2c) <= *(float *)(in_RDI + 4) &&
        *(float *)(in_RDI + 4) != *(float *)((long)in_RDI + 0x2c))) {
      *(undefined4 *)(in_RDI + 4) = *(undefined4 *)((long)in_RDI + 0x2c);
    }
    if (*(float *)(in_RDI + 4) < 0.0) {
      bVar5 = btFabs(*(btScalar *)(in_RDI + 4));
      bVar6 = btFabs(*(btScalar *)(in_RDI + 5));
      if (bVar6 < bVar5) {
        bVar5 = btFabs(*(btScalar *)(in_RDI + 5));
        *(float *)(in_RDI + 4) = -bVar5;
      }
    }
    local_34 = ::operator*(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8->m_floats);
    local_38 = btVector3::dot(&local_24,&local_34);
    local_58 = (btScalar  [4])
               ::operator*((btScalar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                           ,(btVector3 *)in_stack_fffffffffffffed8);
    local_48 = (btScalar  [4])operator-(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    *(float *)((long)in_RDI + 0x24) = *(float *)(in_RDI + 4) * local_14 + local_38;
    btTransform::btTransform
              ((btTransform *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    btCollisionObject::getWorldTransform((btCollisionObject *)in_RDI[2]);
    btTransform::operator=
              ((btTransform *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    stepUp(in_stack_000000d0,(btCollisionWorld *)xform.m_origin.m_floats._8_8_);
    if ((*(byte *)((long)in_RDI + 199) & 1) == 0) {
      in_stack_fffffffffffffee4 = local_14;
      if (*(float *)(in_RDI + 0x19) <= local_14) {
        in_stack_fffffffffffffee4 = *(float *)(in_RDI + 0x19);
      }
      *(float *)(in_RDI + 0x19) = *(float *)(in_RDI + 0x19) - local_14;
      ::operator*(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8->m_floats);
      stepForwardAndStrafe
                (stack0x00000100,(btCollisionWorld *)platformStep.m_floats._4_8_,
                 _platformVerticalOffset);
    }
    else {
      v2 = (btVector3 *)((long)in_RDI + 0x4c);
      operator+(in_stack_fffffffffffffef0,v2);
      pbVar4 = &local_24;
      btVector3::dot(pbVar4,v2);
      ::operator*((btScalar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  (btVector3 *)in_stack_fffffffffffffed8);
      operator-(pbVar4,v2);
      stepForwardAndStrafe
                (stack0x00000100,(btCollisionWorld *)platformStep.m_floats._4_8_,
                 _platformVerticalOffset);
    }
    stepDown(in_stack_00000280,in_stack_00000278,in_stack_00000274);
    btTransform::setOrigin(&local_98,(btVector3 *)((long)in_RDI + 0x6c));
    btCollisionObject::setWorldTransform
              ((btCollisionObject *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

void btKinematicCharacterController::playerStep (  btCollisionWorld* collisionWorld, btScalar dt)
{
//	printf("playerStep(): ");
//	printf("  dt = %f", dt);

	// quick check...
	if (!m_useWalkDirection && !m_platformLinearVelocity && (m_velocityTimeInterval <= 0.0 || m_walkDirection.fuzzyZero())) {
//		printf("\n");
		return;		// no motion
	}

	m_wasOnGround = onGround();

	// Update fall velocity.
	auto upVector = getUpAxisDirections()[m_upAxis];
	m_verticalVelocity -= m_gravity * dt;
	m_verticalVelocity += upVector.dot(m_walkDirection);
	if(m_verticalVelocity > 0.0 && m_verticalVelocity > m_jumpSpeed)
	{
		m_verticalVelocity = m_jumpSpeed;
	}
	if(m_verticalVelocity < 0.0 && btFabs(m_verticalVelocity) > btFabs(m_fallSpeed))
	{
		m_verticalVelocity = -btFabs(m_fallSpeed);
	}

	//printf("m_platformLinearVelocity %f %f %f: %f\n", m_platformLinearVelocity.x(), m_platformLinearVelocity.y(), m_platformLinearVelocity.z(), dt);
	auto platformStep = m_platformLinearVelocity*dt;
	auto platformVerticalOffset = upVector.dot(platformStep);
	auto platformHorizontalStep = platformStep - platformVerticalOffset*upVector;
	m_verticalOffset = platformVerticalOffset + m_verticalVelocity * dt;

	btTransform xform;
	xform = m_ghostObject->getWorldTransform ();

	//printf("m_useWalkDirection %d walkDirection(%f,%f,%f)\n",m_useWalkDirection, m_walkDirection[0],m_walkDirection[1],m_walkDirection[2]);
	//printf("walkSpeed=%f\n",walkSpeed);

	stepUp (collisionWorld);
	if (m_useWalkDirection) {
		stepForwardAndStrafe (collisionWorld, platformHorizontalStep + m_walkDirection - upVector.dot(m_walkDirection)*upVector);
	} else {
		//printf("  time: %f", m_velocityTimeInterval);
		// still have some time left for moving!
		btScalar dtMoving =
			(dt < m_velocityTimeInterval) ? dt : m_velocityTimeInterval;
		m_velocityTimeInterval -= dt;

		// how far will we move while we are moving?
		btVector3 move = m_walkDirection * dtMoving;

		//printf("  dtMoving: %f", dtMoving);

		// okay, step
		stepForwardAndStrafe(collisionWorld, move);
	}
	stepDown (collisionWorld, dt);

	// printf("\n");

	xform.setOrigin (m_currentPosition);
	m_ghostObject->setWorldTransform (xform);
}